

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_builder.cxx
# Opt level: O1

void __thiscall xray_re::xr_mesh_builder::remove_duplicate_faces(xr_mesh_builder *this)

{
  b_face *face;
  b_face *pbVar1;
  pointer pbVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
  _Var6;
  pointer pbVar7;
  long lVar8;
  ulong uVar9;
  b_face *pbVar10;
  
  generate_vertex_faces(this);
  pbVar1 = (this->m_faces).
           super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar10 = (this->m_faces).
                 super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar1; pbVar10 = pbVar10 + 1
      ) {
    uVar9 = (ulong)(this->m_vertex_faces).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[(pbVar10->field_0).field_0.v[0]];
    do {
      if (uVar9 == 0xffffffff) {
        uVar5 = 5;
        break;
      }
      pbVar2 = (this->m_faces).
               super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
               ._M_impl.super__Vector_impl_data._M_start;
      face = pbVar2 + uVar9;
      if ((pbVar10 < face) && (bVar4 = b_face::is_duplicate(pbVar10,face), bVar4)) {
        (pbVar10->field_1).field_1.surf_idx = 0xffffffff;
        uVar5 = 7;
        bVar4 = false;
      }
      else {
        lVar3 = 0;
        do {
          lVar8 = lVar3;
          if (lVar8 == -3) {
            uVar9 = 0;
            goto LAB_001745be;
          }
          lVar3 = lVar8 + -1;
        } while (*(uint32_t *)((long)&pbVar2[uVar9].field_0 + lVar8 * 4 + 8) !=
                 (pbVar10->field_0).field_0.v[0]);
        uVar9 = (ulong)*(uint *)((long)&face->field_0 + lVar8 * 4 + 0x2c);
LAB_001745be:
        if (lVar8 == -3) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_builder.h"
                        ,0xa4,
                        "uint32_t xray_re::xr_mesh_builder::b_face::next_face_idx(uint_fast32_t) const"
                       );
        }
        uVar5 = 0;
        bVar4 = true;
      }
    } while (bVar4);
    if ((uVar5 | 2) != 7) break;
  }
  _Var6 = std::
          __remove_if<__gnu_cxx::__normal_iterator<xray_re::xr_mesh_builder::b_face*,std::vector<xray_re::xr_mesh_builder::b_face,std::allocator<xray_re::xr_mesh_builder::b_face>>>,__gnu_cxx::__ops::_Iter_pred<bad_face_pred>>
                    ((this->m_faces).
                     super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->m_faces).
                     super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  pbVar10 = (this->m_faces).
            super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((_Var6._M_current != pbVar10) &&
     (pbVar2 = (this->m_faces).
               super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
               ._M_impl.super__Vector_impl_data._M_finish,
     pbVar7 = (pointer)((long)_Var6._M_current + ((long)pbVar2 - (long)pbVar10)), pbVar2 != pbVar7))
  {
    (this->m_faces).
    super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar7;
  }
  return;
}

Assistant:

void xr_mesh_builder::remove_duplicate_faces()
{
	generate_vertex_faces();
	for (b_face_vec_it it = m_faces.begin(), end = m_faces.end(); it != end; ++it) {
		for (uint_fast32_t next = m_vertex_faces[it->v0]; next != BAD_IDX;) {
			b_face* face = &m_faces[next];
			if (face > &*it && it->is_duplicate(*face)) {
				it->surf_idx = BAD_IDX;
				goto skip;
			}
			next = face->next_face_idx(it->v0);
		}
skip:;
	}
	m_faces.erase(std::remove_if(m_faces.begin(), m_faces.end(), bad_face_pred()), m_faces.end());
}